

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O0

void Bmc_BmciUnfold(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vFFLits,int fPiReuse)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint local_54;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  int fPiReuse_local;
  Vec_Int_t *vFFLits_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ManRegNum(p);
  iVar2 = Vec_IntSize(vFFLits);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManRegNum(p) == Vec_IntSize(vFFLits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                  ,0x5f,"void Bmc_BmciUnfold(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
  }
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (local_34 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_30 = Gia_ManCi(p,iVar1 + local_34);
      bVar5 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    uVar3 = Vec_IntEntry(vFFLits,local_34);
    pGStack_30->Value = uVar3;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar5 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCi(p,local_34);
      bVar5 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    if (fPiReuse == 0) {
      local_54 = Gia_ManAppendCi(pNew);
    }
    else {
      iVar1 = Gia_ManPiNum(pNew);
      iVar2 = Gia_ManPiNum(p);
      pGVar4 = Gia_ManPi(pNew,(iVar1 - iVar2) + local_34);
      local_54 = Gia_ObjToLit(pNew,pGVar4);
    }
    pGStack_30->Value = local_54;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar5 = false;
    if (local_34 < p->nObjs) {
      pGStack_30 = Gia_ManObj(p,local_34);
      bVar5 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      iVar2 = Gia_ObjFanin1Copy(pGStack_30);
      uVar3 = Gia_ManHashAnd(pNew,iVar1,iVar2);
      pGStack_30->Value = uVar3;
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (local_34 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pGStack_30 = Gia_ManCo(p,iVar1 + local_34);
      bVar5 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_30);
    Vec_IntWriteEntry(vFFLits,local_34,iVar1);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Bmc_BmciUnfold( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vFFLits, int fPiReuse )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == Vec_IntSize(vFFLits) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Vec_IntEntry(vFFLits, i);
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = fPiReuse ? Gia_ObjToLit(pNew, Gia_ManPi(pNew, Gia_ManPiNum(pNew)-Gia_ManPiNum(p)+i)) : Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntWriteEntry( vFFLits, i, Gia_ObjFanin0Copy(pObj) );
}